

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O1

DBaseStatusBar * CreateCustomStatusBar(int script)

{
  DSBarInfo *this;
  
  if (SBarInfoScript[script] == (SBarInfo *)0x0) {
    I_FatalError("Tried to create a status bar with no script!");
  }
  this = (DSBarInfo *)
         M_Malloc_Dbg(0xe8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                      ,0x1f9);
  DSBarInfo::DSBarInfo(this,SBarInfoScript[script]);
  return &this->super_DBaseStatusBar;
}

Assistant:

DBaseStatusBar *CreateCustomStatusBar (int script)
{
	if(SBarInfoScript[script] == NULL)
		I_FatalError("Tried to create a status bar with no script!");
	return new DSBarInfo(SBarInfoScript[script]);
}